

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

mraa_result_t mraa_gpio_edge_mode(mraa_gpio_context dev,mraa_gpio_edge_t mode)

{
  uint uVar1;
  int __fd;
  mraa_gpio_events_t pmVar2;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  int local_bc;
  char local_b8 [4];
  int length;
  char bu [64];
  char local_68 [4];
  int edge;
  char filepath [64];
  mraa_gpio_context it;
  int i;
  mraa_gpio_edge_t mode_local;
  mraa_gpio_context dev_local;
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: edge_mode: context is invalid");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else if (((dev == (mraa_gpio_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
          (dev->advance_func->gpio_edge_mode_replace ==
           (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t *)0x0)) {
    if ((dev->events == (mraa_gpio_events_t)0x0) && (mode != MRAA_GPIO_EDGE_NONE)) {
      pmVar2 = (mraa_gpio_events_t)malloc((ulong)dev->num_pins << 4);
      dev->events = pmVar2;
      if (dev->events == (mraa_gpio_events_t)0x0) {
        syslog(3,"mraa_gpio_edge_mode() malloc error");
        return MRAA_ERROR_NO_RESOURCES;
      }
      for (it._0_4_ = 0; (uint)it < dev->num_pins; it._0_4_ = (uint)it + 1) {
        dev->events[(int)(uint)it].id = -1;
      }
    }
    filepath._56_8_ = dev;
    if (plat->chardev_capable == 0) {
      for (; filepath._56_8_ != 0; filepath._56_8_ = *(undefined8 *)(filepath._56_8_ + 0x80)) {
        if (*(int *)(filepath._56_8_ + 8) != -1) {
          close(*(int *)(filepath._56_8_ + 8));
          *(undefined4 *)(filepath._56_8_ + 8) = 0xffffffff;
        }
        snprintf(local_68,0x40,"/sys/class/gpio/gpio%d/edge",(ulong)*(uint *)filepath._56_8_);
        __fd = open(local_68,2);
        if (__fd == -1) {
          uVar1 = *(uint *)filepath._56_8_;
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          syslog(3,"gpio%i: edge_mode: Failed to open \'edge\' for writing: %s",(ulong)uVar1,pcVar4)
          ;
          return MRAA_ERROR_INVALID_RESOURCE;
        }
        switch(mode) {
        case MRAA_GPIO_EDGE_NONE:
          local_bc = snprintf(local_b8,0x40,"none");
          break;
        case MRAA_GPIO_EDGE_BOTH:
          local_bc = snprintf(local_b8,0x40,"both");
          break;
        case MRAA_GPIO_EDGE_RISING:
          local_bc = snprintf(local_b8,0x40,"rising");
          break;
        case MRAA_GPIO_EDGE_FALLING:
          local_bc = snprintf(local_b8,0x40,"falling");
          break;
        default:
          close(__fd);
          return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }
        sVar5 = write(__fd,local_b8,(long)local_bc);
        if (sVar5 == -1) {
          uVar1 = *(uint *)filepath._56_8_;
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          syslog(3,"gpio%i: edge_mode: Failed to write to \'edge\': %s",(ulong)uVar1,pcVar4);
          close(__fd);
          return MRAA_ERROR_UNSPECIFIED;
        }
        close(__fd);
      }
      dev_local._4_4_ = MRAA_SUCCESS;
    }
    else {
      dev_local._4_4_ = mraa_gpio_chardev_edge_mode(dev,mode);
    }
  }
  else {
    dev_local._4_4_ = (*dev->advance_func->gpio_edge_mode_replace)(dev,mode);
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_gpio_edge_mode(mraa_gpio_context dev, mraa_gpio_edge_t mode)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: edge_mode: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, gpio_edge_mode_replace))
        return dev->advance_func->gpio_edge_mode_replace(dev, mode);

    /* Initialize events array. */
    if (dev->events == NULL && mode != MRAA_GPIO_EDGE_NONE) {
        dev->events = malloc(dev->num_pins * sizeof(mraa_gpio_event));
        if (dev->events == NULL) {
            syslog(LOG_ERR, "mraa_gpio_edge_mode() malloc error");
            return MRAA_ERROR_NO_RESOURCES;
        }

        for (int i = 0; i < dev->num_pins; ++i) {
            dev->events[i].id = -1;
        }
    }

    if (plat->chardev_capable)
        return mraa_gpio_chardev_edge_mode(dev, mode);

    mraa_gpio_context it = dev;

    while (it) {

        if (it->value_fp != -1) {
            close(it->value_fp);
            it->value_fp = -1;
        }

        char filepath[MAX_SIZE];
        snprintf(filepath, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/edge", it->pin);

        int edge = open(filepath, O_RDWR);
        if (edge == -1) {
            syslog(LOG_ERR, "gpio%i: edge_mode: Failed to open 'edge' for writing: %s", it->pin,
                   strerror(errno));
            return MRAA_ERROR_INVALID_RESOURCE;
        }

        char bu[MAX_SIZE];
        int length;
        switch (mode) {
            case MRAA_GPIO_EDGE_NONE:
                length = snprintf(bu, sizeof(bu), "none");
                break;
            case MRAA_GPIO_EDGE_BOTH:
                length = snprintf(bu, sizeof(bu), "both");
                break;
            case MRAA_GPIO_EDGE_RISING:
                length = snprintf(bu, sizeof(bu), "rising");
                break;
            case MRAA_GPIO_EDGE_FALLING:
                length = snprintf(bu, sizeof(bu), "falling");
                break;
            default:
                close(edge);
                return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }
        if (write(edge, bu, length * sizeof(char)) == -1) {
            syslog(LOG_ERR, "gpio%i: edge_mode: Failed to write to 'edge': %s", it->pin, strerror(errno));
            close(edge);
            return MRAA_ERROR_UNSPECIFIED;
        }

        close(edge);

        it = it->next;
    }

    return MRAA_SUCCESS;
}